

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetTxOutOnly_Test::TestBody(Psbt_SetTxOutOnly_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_3;
  Psbt psbt2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TxOutReference txout_2r;
  TxOut txout_2;
  TxOut txout_1;
  Amount amount;
  Address addr2;
  Address addr1;
  KeyData key2;
  KeyData key1;
  string path2;
  string path1;
  HDWallet wallet2;
  HDWallet wallet1;
  AssertionResult gtest_ar;
  Psbt psbt;
  type *in_stack_fffffffffffff618;
  undefined7 in_stack_fffffffffffff620;
  undefined1 in_stack_fffffffffffff627;
  int *in_stack_fffffffffffff628;
  undefined7 in_stack_fffffffffffff630;
  undefined1 in_stack_fffffffffffff637;
  char *in_stack_fffffffffffff638;
  AssertHelper local_988;
  Message local_980;
  string local_978 [32];
  AssertionResult local_958;
  ByteData local_948;
  Psbt local_930;
  AssertHelper local_8b0;
  Message local_8a8 [4];
  string local_888 [32];
  AssertionResult local_868;
  AssertHelper local_858;
  Message local_850;
  undefined4 local_848;
  undefined4 local_844;
  AssertionResult local_840;
  TxOutReference local_830 [80];
  TxOut local_7e0 [80];
  TxOut local_790 [80];
  Amount local_740 [16];
  Pubkey local_730;
  Address local_718 [376];
  Pubkey local_5a0;
  Address local_588 [376];
  undefined1 local_410 [336];
  undefined1 local_2c0 [343];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  ByteData local_120;
  HDWallet local_108 [24];
  ByteData local_f0;
  HDWallet local_d8 [24];
  AssertHelper local_c0;
  Message local_b8 [3];
  undefined4 local_a0;
  undefined4 local_9c;
  AssertionResult local_98;
  Psbt local_88;
  
  cfd::Psbt::Psbt(&local_88);
  local_9c = 0;
  local_a0 = cfd::core::Psbt::GetTxOutCount();
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (in_stack_fffffffffffff638,
             (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
             in_stack_fffffffffffff628,
             (uint *)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
             in_stack_fffffffffffff618);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x258769);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x37b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message((Message *)0x2587c6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25881e);
  cfd::core::ByteData::ByteData(&local_f0,(string *)&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_d8,&local_f0);
  cfd::core::ByteData::~ByteData((ByteData *)0x258858);
  cfd::core::ByteData::ByteData(&local_120,(string *)&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_108,&local_120);
  cfd::core::ByteData::~ByteData((ByteData *)0x258892);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"44h/0h/0h/0/2",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"44h/0h/0h/0/2",&local_169);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_2c0,(string *)local_d8);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_410,(string *)local_108);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Address::Address(local_588,kTestnet,kVersion0,&local_5a0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x258990);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Address::Address(local_718,kTestnet,kVersion0,&local_730);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2589d2);
  cfd::core::Amount::Amount(local_740,100000000);
  cfd::core::TxOut::TxOut(local_790,local_740,local_588);
  cfd::core::TxOut::TxOut(local_7e0,local_740,local_718);
  cfd::core::TxOutReference::TxOutReference(local_830,local_7e0);
  cfd::core::Psbt::AddTxOut((TxOut *)&local_88);
  cfd::core::Psbt::AddTxOut((TxOutReference *)&local_88);
  local_844 = 2;
  local_848 = cfd::core::Psbt::GetTxOutCount();
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            (in_stack_fffffffffffff638,
             (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
             in_stack_fffffffffffff628,
             (uint *)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_840);
  if (!bVar1) {
    testing::Message::Message(&local_850);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x258cf0);
    testing::internal::AssertHelper::AssertHelper
              (&local_858,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x38c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_858,&local_850);
    testing::internal::AssertHelper::~AssertHelper(&local_858);
    testing::Message::~Message((Message *)0x258d4d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x258da5);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_868,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000"
             ,pcVar3);
  std::__cxx11::string::~string(local_888);
  cfd::core::ByteData::~ByteData((ByteData *)0x258e21);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_868);
  if (!bVar1) {
    testing::Message::Message(local_8a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x258ed3);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x38e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8b0,local_8a8);
    testing::internal::AssertHelper::~AssertHelper(&local_8b0);
    testing::Message::~Message((Message *)0x258f30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x258f88);
  cfd::core::Psbt::GetData();
  cfd::Psbt::Psbt(&local_930,&local_948);
  cfd::core::ByteData::~ByteData((ByteData *)0x258fc3);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_958,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,pcVar3);
  std::__cxx11::string::~string(local_978);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_958);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_980);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2590dd);
    testing::internal::AssertHelper::AssertHelper
              (&local_988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x390,pcVar3);
    testing::internal::AssertHelper::operator=(&local_988,&local_980);
    testing::internal::AssertHelper::~AssertHelper(&local_988);
    testing::Message::~Message((Message *)0x259129);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25917b);
  cfd::Psbt::~Psbt((Psbt *)CONCAT17(uVar2,in_stack_fffffffffffff620));
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x259195);
  cfd::core::TxOut::~TxOut((TxOut *)0x2591a2);
  cfd::core::TxOut::~TxOut((TxOut *)0x2591af);
  cfd::core::Address::~Address((Address *)CONCAT17(uVar2,in_stack_fffffffffffff620));
  cfd::core::Address::~Address((Address *)CONCAT17(uVar2,in_stack_fffffffffffff620));
  cfd::core::KeyData::~KeyData((KeyData *)CONCAT17(uVar2,in_stack_fffffffffffff620));
  cfd::core::KeyData::~KeyData((KeyData *)CONCAT17(uVar2,in_stack_fffffffffffff620));
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_140);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x25920a);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x259217);
  cfd::Psbt::~Psbt((Psbt *)CONCAT17(uVar2,in_stack_fffffffffffff620));
  return;
}

Assistant:

TEST(Psbt, SetTxOutOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxOutCount());
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  Amount amount(100000000);
  TxOut txout_1(amount, addr1);
  TxOut txout_2(amount, addr2);
  TxOutReference txout_2r(txout_2);
  psbt.AddTxOut(txout_1);
  psbt.AddTxOut(txout_2r);
  EXPECT_EQ(2, psbt.GetTxOutCount());

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=", psbt2.GetBase64().c_str());
}